

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_distribution_(Integer *g_a,Integer *proc,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi
                     )

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_R8;
  undefined8 *in_R9;
  Integer hi [2];
  Integer lo [2];
  Integer *in_stack_000002b8;
  Integer *in_stack_000002c0;
  Integer in_stack_000002c8;
  Integer in_stack_000002d0;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  pnga_distribution(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8);
  *in_RDX = local_48;
  *in_R8 = local_40;
  *in_RCX = local_58;
  *in_R9 = local_50;
  return;
}

Assistant:

void FATR ga_distribution_(Integer *g_a, Integer *proc, Integer *ilo,
                           Integer *ihi, Integer *jlo, Integer *jhi)
{
  Integer lo[2], hi[2];
  wnga_distribution(*g_a, *proc, lo, hi);
  *ilo = lo[0];
  *jlo = lo[1];
  *ihi = hi[0];
  *jhi = hi[1];
}